

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccipher.t.c
# Opt level: O1

void test_cipher_substitution_with_data(void)

{
  FILE *pFVar1;
  char key [27];
  cipher_data data2;
  cipher_data data;
  char result2 [261];
  char result [261];
  char text [261];
  text_scorer scorer;
  
  pFVar1 = fopen("./english_quadgrams.txt","r");
  scorer_load_data(&stack0xffffffffffe41b90,pFVar1);
  memcpy(&stack0xffffffffffe41a88,
         "SOWFBRKAWFCZFSBSCSBQITBKOWLBFXTBKOWLSOXSOXFZWWIBICFWUQLRXINOCIJLWJFQUNWXLFBSZXFBTXAANTQIFBFSFQUFCZFSBSCSBIMWHWLNKAXBISWGSTOXLXTSWLUQLXJBUUWLWISTBKOWLSWGSTOXLXTSWLBSJBUUWLFULQRTXWFXLTBKOWLBISOXSSOWTBKOWLXAKOXZWSBFIQSFBRKANSOWXAKOXZWSFOBUSWJBSBFTQRKAWSWANECRZAWJ"
         ,0x105);
  substitution_with_data(&stack0xffffffffffe41838);
  UnityAssertEqualNumber(1,0,(char *)0x0,0xd8,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualString("LIUZJSXVNDPRGYHQOMTCFKEAWB",&stack0xffffffffffe417e8,(char *)0x0,0xd9);
  UnityAssertEqualString
            ("THESIMPLESUBSTITUTIONCIPHERISACIPHERTHATHASBEENINUSEFORMANYHUNDREDSOFYEARSITBASICALLYCONSISTSOFSUBSTITUTINGEVERYPLAINTEXTCHARACTERFORADIFFERENTCIPHERTEXTCHARACTERITDIFFERSFROMCAESARCIPHERINTHATTHECIPHERALPHABETISNOTSIMPLYTHEALPHABETSHIFTEDITISCOMPLETELYJUMBLED"
             ,&stack0xffffffffffe41978,(char *)0x0,0xdd);
  substitution_with_data(&stack0xffffffffffe41808);
  UnityAssertEqualNumber(1,0,(char *)0x0,0xed,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualString
            ("THESIMPLESUBSTITUTIONCIPHERISACIPHERTHATHASBEENINUSEFORMANYHUNDREDSOFYEARSITBASICALLYCONSISTSOFSUBSTITUTINGEVERYPLAINTEXTCHARACTERFORADIFFERENTCIPHERTEXTCHARACTERITDIFFERSFROMCAESARCIPHERINTHATTHECIPHERALPHABETISNOTSIMPLYTHEALPHABETSHIFTEDITISCOMPLETELYJUMBLED"
             ,&stack0xffffffffffe41868,(char *)0x0,0xf1);
  return;
}

Assistant:

void test_cipher_substitution_with_data(void)
{
	// Load the quadgram data
	struct text_scorer scorer;
	scorer_load_data(&scorer, fopen("./english_quadgrams.txt", "r"));

	// Test autocrack

	char text[] = "SOWFBRKAWFCZFSBSCSBQITBKOWLBFXTBKOWLSOXSOXFZWWIBICFWUQLRXINOCIJLWJFQUNWXLFBSZXFBT"
				  "XAANTQIFBFSFQUFCZFSBSCSBIMWHWLNKAXBISWGSTOXLXTSWLUQLXJBUUWLWISTBKOWLSWGSTOXLXTSWL"
				  "BSJBUUWLFULQRTXWFXLTBKOWLBISOXSSOWTBKOWLXAKOXZWSBFIQSFBRKANSOWXAKOXZWSFOBUSWJBSBF"
				  "TQRKAWSWANECRZAWJ";
	char result[sizeof(text)];
	char key[27];

	struct cipher_data data = {
			.ct = text,
			.key = key,
			.use_autocrack = true,
			.scorer = &scorer,
			.result = result,
	};

	substitution_with_data(&data);

	TEST_ASSERT_EQUAL_INT(true, data.success);
	TEST_ASSERT_EQUAL_STRING("LIUZJSXVNDPRGYHQOMTCFKEAWB", data.key);
	TEST_ASSERT_EQUAL_STRING("THESIMPLESUBSTITUTIONCIPHERISACIPHERTHATHASBEENINUSEFORMANYHUNDREDSOFYEARSITBASIC"
							 "ALLYCONSISTSOFSUBSTITUTINGEVERYPLAINTEXTCHARACTERFORADIFFERENTCIPHERTEXTCHARACTER"
							 "ITDIFFERSFROMCAESARCIPHERINTHATTHECIPHERALPHABETISNOTSIMPLYTHEALPHABETSHIFTEDITIS"
							 "COMPLETELYJUMBLED", data.result);

	// Test solve with key

	char result2[sizeof(text)];

	struct cipher_data data2 = {
			.ct = text,
			.key = "LIUZJSXVNDPRGYHQOMTCFKEAWB",
			.use_autocrack = false,
			.scorer = &scorer,
			.result = result2,
	};

	substitution_with_data(&data2);

	TEST_ASSERT_EQUAL_INT(true, data2.success);
	TEST_ASSERT_EQUAL_STRING("THESIMPLESUBSTITUTIONCIPHERISACIPHERTHATHASBEENINUSEFORMANYHUNDREDSOFYEARSITBASIC"
							 "ALLYCONSISTSOFSUBSTITUTINGEVERYPLAINTEXTCHARACTERFORADIFFERENTCIPHERTEXTCHARACTER"
							 "ITDIFFERSFROMCAESARCIPHERINTHATTHECIPHERALPHABETISNOTSIMPLYTHEALPHABETSHIFTEDITIS"
							 "COMPLETELYJUMBLED", data2.result);
}